

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbrt2obj.cpp
# Opt level: O0

void pbrt::defineDefaultMaterials(ofstream *file)

{
  ostream *poVar1;
  void *this;
  ostream *in_RDI;
  
  poVar1 = std::operator<<(in_RDI,"newmtl pbrt_parser_no_materials_yet");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDI,"Kd .6 .6 .6");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDI,"Ka .1 .1 .1");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDI,"usematerial pbrt_parser_no_materials_yet");
  this = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void defineDefaultMaterials(std::ofstream &file)
  {
    file << "newmtl pbrt_parser_no_materials_yet" << std::endl;
    file << "Kd .6 .6 .6" << std::endl;
    file << "Ka .1 .1 .1" << std::endl;
    file << "usematerial pbrt_parser_no_materials_yet" << std::endl << std::endl;
  }